

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_extra_drop_info.cpp
# Opt level: O2

void __thiscall
duckdb::ExtraDropSecretInfo::Serialize(ExtraDropSecretInfo *this,Serializer *serializer)

{
  ExtraDropInfo::Serialize(&this->super_ExtraDropInfo,serializer);
  Serializer::WriteProperty<duckdb::SecretPersistType>
            (serializer,200,"persist_mode",&(this->super_ExtraDropInfo).field_0x9);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xc9,"secret_storage",&this->secret_storage);
  return;
}

Assistant:

void ExtraDropSecretInfo::Serialize(Serializer &serializer) const {
	ExtraDropInfo::Serialize(serializer);
	serializer.WriteProperty<SecretPersistType>(200, "persist_mode", persist_mode);
	serializer.WritePropertyWithDefault<string>(201, "secret_storage", secret_storage);
}